

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

BinaryExpr<const_frozen::basic_string<char32_t>_&,_const_frozen::basic_string<char32_t>_&> *
__thiscall
Catch::ExprLhs<frozen::basic_string<char32_t>const&>::operator==
          (BinaryExpr<const_frozen::basic_string<char32_t>_&,_const_frozen::basic_string<char32_t>_&>
           *__return_storage_ptr__,ExprLhs<frozen::basic_string<char32_t>const&> *this,
          basic_string<char32_t> *rhs)

{
  basic_string<char32_t> *pbVar1;
  size_t sVar2;
  bool bVar3;
  size_t sVar4;
  StringRef local_38;
  
  pbVar1 = *(basic_string<char32_t> **)this;
  sVar2 = rhs->size_;
  if (pbVar1->size_ == sVar2) {
    bVar3 = true;
    if (sVar2 != 0) {
      sVar4 = 0;
      do {
        if (pbVar1->data_[sVar4] != rhs->data_[sVar4]) goto LAB_001818d9;
        sVar4 = sVar4 + 1;
      } while (sVar2 != sVar4);
    }
  }
  else {
LAB_001818d9:
    bVar3 = false;
  }
  StringRef::StringRef(&local_38,"==");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = bVar3;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001d0a28;
  __return_storage_ptr__->m_lhs = pbVar1;
  (__return_storage_ptr__->m_op).m_start = local_38.m_start;
  (__return_storage_ptr__->m_op).m_size = local_38.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }